

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar2;
  undefined4 in_register_00000034;
  int status;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  sqlite3_stmt *sql;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff4f;
  Logic_error *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  sql = this->stmt_;
  iVar1 = bind_parameter_index((Stmt *)CONCAT44(in_register_00000034,__fd),(string *)__addr);
  iVar1 = sqlite3_bind_text(sql,iVar1,__addr,0xffffffff,0xffffffffffffffff);
  if (iVar1 != 0) {
    uVar3 = 1;
    db = (sqlite3 *)__cxa_allocate_exception(0x48);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            sqlite3_errmsg(this->db_);
    std::operator+(__lhs,in_stack_ffffffffffffff20);
    pcVar2 = (char *)sqlite3_sql(this->stmt_);
    iVar1 = (int)((ulong)this >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff50,pcVar2,(allocator *)&stack0xffffffffffffff4f);
    Logic_error::Logic_error
              (in_stack_ffffffffffffff50,
               (string *)
               CONCAT17(in_stack_ffffffffffffff4f,CONCAT16(uVar3,in_stack_ffffffffffffff48)),
               (string *)sql,iVar1,db);
    __cxa_throw(db,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return iVar1;
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const char * val)
    {
        int status = sqlite3_bind_text(stmt_, bind_parameter_index(name), val, -1, SQLITE_TRANSIENT);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }